

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall cmOrderDirectories::DiagnoseCycle(cmOrderDirectories *this)

{
  pointer ppVar1;
  __uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  _Var2;
  cmake *this_00;
  ostream *poVar3;
  string *psVar4;
  uint uVar5;
  ulong uVar6;
  ConflictPair *j;
  pointer ppVar7;
  pointer pCVar8;
  undefined1 local_1d8 [16];
  string local_1c8;
  ostringstream e;
  
  if (this->CycleDiagnosed == false) {
    this->CycleDiagnosed = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"Cannot generate a safe ");
    poVar3 = std::operator<<(poVar3,(string *)&this->Purpose);
    poVar3 = std::operator<<(poVar3," for target ");
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3," because there is a cycle in the constraint graph:\n");
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      pCVar8 = (this->ConflictGraph).
               super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->ConflictGraph).
                         super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8) / 0x18) <= uVar6
         ) break;
      poVar3 = std::operator<<((ostream *)&e,"  dir ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," is [");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((this->OriginalDirectories).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"]\n");
      pCVar8 = pCVar8 + uVar6;
      ppVar1 = *(pointer *)
                ((long)&(pCVar8->
                        super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl + 8);
      for (ppVar7 = *(pointer *)
                     &(pCVar8->
                      super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl; ppVar7 != ppVar1; ppVar7 = ppVar7 + 1) {
        poVar3 = std::operator<<((ostream *)&e,"    dir ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar7->first);
        std::operator<<(poVar3," must precede it due to ");
        _Var2._M_t.
        super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
        .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl =
             (this->ConstraintEntries).
             super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[ppVar7->second]._M_t.
             super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
             ._M_t;
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
                              .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var2._M_t.
                   super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
                   .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl,&e);
        std::operator<<((ostream *)&e,"\n");
      }
      uVar5 = uVar5 + 1;
    }
    std::operator<<((ostream *)&e,"Some of these libraries may not be found correctly.");
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d8);
    cmake::IssueMessage(this_00,WARNING,(string *)(local_1d8 + 0x10),
                        (cmListFileBacktrace *)local_1d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
    std::__cxx11::string::~string((string *)(local_1d8 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return;
}

Assistant:

void cmOrderDirectories::DiagnoseCycle()
{
  // Report the cycle at most once.
  if (this->CycleDiagnosed) {
    return;
  }
  this->CycleDiagnosed = true;

  // Construct the message.
  std::ostringstream e;
  e << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because there is a cycle in the constraint graph:\n";

  // Display the conflict graph.
  for (unsigned int i = 0; i < this->ConflictGraph.size(); ++i) {
    ConflictList const& clist = this->ConflictGraph[i];
    e << "  dir " << i << " is [" << this->OriginalDirectories[i] << "]\n";
    for (ConflictPair const& j : clist) {
      e << "    dir " << j.first << " must precede it due to ";
      this->ConstraintEntries[j.second]->Report(e);
      e << "\n";
    }
  }
  e << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING, e.str(), this->Target->GetBacktrace());
}